

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected-main.t.hpp
# Opt level: O2

ostream * lest::operator<<(ostream *os,expected<Implicit,_char> *v)

{
  ostream *poVar1;
  value_type *item;
  allocator<char> local_39;
  ForStreamable<Implicit,_std::string> local_38;
  
  poVar1 = std::operator<<(os,"[expected:");
  if ((v->contained).super_storage_t_impl<Implicit,_char>.m_has_value == true) {
    item = nonstd::expected_lite::expected<Implicit,_char>::operator*(v);
    make_string<Implicit>(&local_38,item);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"[empty]",&local_39);
  }
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,"]");
  std::__cxx11::string::~string((string *)&local_38);
  return poVar1;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, nonstd::expected<T,E> const & v )
{
    using lest::to_string;
    return os << "[expected:" << (v ? to_string(*v) : "[empty]") << "]";
}